

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O2

int cpackDefinitionArgument(char *argument,char *cValue,void *call_data)

{
  cmCPackLog *pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string key;
  string value;
  char *local_1a8 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string((string *)&value,cValue,(allocator *)&cmCPackLog_msg);
  lVar2 = std::__cxx11::string::find_first_of((char *)&value,0x4d7e5e);
  if (lVar2 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Please specify CPack definitions as: KEY=VALUE");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = *(cmCPackLog **)((long)call_data + 0x30);
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x56,key._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  }
  else {
    std::__cxx11::string::substr((ulong)&key,(ulong)&value);
    std::__cxx11::string::assign((char *)&value);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)call_data,&key);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Set CPack variable: ");
    poVar4 = std::operator<<(poVar4,(string *)&key);
    poVar4 = std::operator<<(poVar4," to \"");
    poVar4 = std::operator<<(poVar4,(string *)&value);
    poVar4 = std::operator<<(poVar4,"\"");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = *(cmCPackLog **)((long)call_data + 0x30);
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x5d,local_1a8[0]);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&key);
  }
  std::__cxx11::string::~string((string *)&value);
  return (uint)(lVar2 != -1);
}

Assistant:

int cpackDefinitionArgument(const char* argument, const char* cValue,
  void* call_data)
{
  (void)argument;
  cpackDefinitions* def = static_cast<cpackDefinitions*>(call_data);
  std::string value = cValue;
  size_t pos = value.find_first_of("=");
  if ( pos == std::string::npos )
    {
    cmCPack_Log(def->Log, cmCPackLog::LOG_ERROR,
      "Please specify CPack definitions as: KEY=VALUE" << std::endl);
    return 0;
    }
  std::string key = value.substr(0, pos);
  value = value.c_str() + pos + 1;
  def->Map[key] = value;
  cmCPack_Log(def->Log, cmCPackLog::LOG_DEBUG, "Set CPack variable: "
    << key << " to \"" << value << "\"" << std::endl);
  return 1;
}